

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

bool jpge::compress_image_to_jpeg_file
               (char *pFilename,int width,int height,int num_channels,uint8 *pImage_data,
               params *comp_params)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int __oflag;
  EVP_PKEY_CTX *ctx;
  uint8 *pBuf;
  int i;
  uint pass_index;
  jpeg_encoder dst_image;
  undefined1 local_50 [8];
  cfile_stream dst_stream;
  params *comp_params_local;
  uint8 *pImage_data_local;
  int num_channels_local;
  int height_local;
  int width_local;
  char *pFilename_local;
  
  dst_stream._16_8_ = comp_params;
  cfile_stream::cfile_stream((cfile_stream *)local_50);
  uVar2 = cfile_stream::open((cfile_stream *)local_50,pFilename,__oflag);
  if ((uVar2 & 1) == 0) {
    pFilename_local._7_1_ = false;
    dst_image.m_bits_in = 1;
  }
  else {
    jpeg_encoder::jpeg_encoder((jpeg_encoder *)&i);
    ctx = (EVP_PKEY_CTX *)local_50;
    uVar2 = jpeg_encoder::init((jpeg_encoder *)&i,ctx);
    if ((uVar2 & 1) == 0) {
      pFilename_local._7_1_ = false;
    }
    else {
      pBuf._4_4_ = 0;
      while( true ) {
        iVar4 = (int)ctx;
        uVar3 = jpeg_encoder::get_total_passes((jpeg_encoder *)&i);
        if (uVar3 <= pBuf._4_4_) break;
        for (pBuf._0_4_ = 0; (int)pBuf < height; pBuf._0_4_ = (int)pBuf + 1) {
          bVar1 = jpeg_encoder::process_scanline
                            ((jpeg_encoder *)&i,pImage_data + (int)pBuf * width * num_channels);
          if (!bVar1) {
            pFilename_local._7_1_ = false;
            goto LAB_001918ca;
          }
        }
        ctx = (EVP_PKEY_CTX *)0x0;
        bVar1 = jpeg_encoder::process_scanline((jpeg_encoder *)&i,(void *)0x0);
        if (!bVar1) {
          pFilename_local._7_1_ = false;
          goto LAB_001918ca;
        }
        pBuf._4_4_ = pBuf._4_4_ + 1;
      }
      jpeg_encoder::deinit((jpeg_encoder *)&i);
      iVar4 = cfile_stream::close((cfile_stream *)local_50,iVar4);
      pFilename_local._7_1_ = (bool)((byte)iVar4 & 1);
    }
LAB_001918ca:
    dst_image.m_bits_in = 1;
    jpeg_encoder::~jpeg_encoder((jpeg_encoder *)&i);
  }
  cfile_stream::~cfile_stream((cfile_stream *)local_50);
  return pFilename_local._7_1_;
}

Assistant:

bool compress_image_to_jpeg_file(const char* pFilename, int width, int height, int num_channels, const uint8* pImage_data, const params& comp_params)
	{
		cfile_stream dst_stream;
		if (!dst_stream.open(pFilename))
			return false;

		jpge::jpeg_encoder dst_image;
		if (!dst_image.init(&dst_stream, width, height, num_channels, comp_params))
			return false;

		for (uint pass_index = 0; pass_index < dst_image.get_total_passes(); pass_index++)
		{
			for (int i = 0; i < height; i++)
			{
				const uint8* pBuf = pImage_data + i * width * num_channels;
				if (!dst_image.process_scanline(pBuf))
					return false;
			}
			if (!dst_image.process_scanline(NULL))
				return false;
		}

		dst_image.deinit();

		return dst_stream.close();
	}